

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvlat1.cpp
# Opt level: O1

void ucnv_ASCIIFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                       UErrorCode *pErrorCode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte *pbVar17;
  bool bVar18;
  byte *pbVar19;
  byte *pbVar20;
  UErrorCode UVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  
  if (pToUArgs->converter->toULength < '\x01') {
    pbVar19 = (byte *)pToUArgs->source;
    pbVar17 = (byte *)pToUArgs->sourceLimit;
    pbVar20 = (byte *)pFromUArgs->target;
    uVar24 = *(int *)&pFromUArgs->targetLimit - (int)pbVar20;
    uVar22 = (int)pbVar17 - (int)pbVar19;
    if ((int)uVar24 <= (int)uVar22) {
      uVar22 = uVar24;
    }
    if (0xf < (int)uVar22) {
      uVar24 = uVar22 >> 4;
      do {
        bVar1 = *pbVar19;
        *pbVar20 = bVar1;
        bVar2 = pbVar19[1];
        pbVar20[1] = bVar2;
        bVar3 = pbVar19[2];
        pbVar20[2] = bVar3;
        bVar4 = pbVar19[3];
        pbVar20[3] = bVar4;
        bVar5 = pbVar19[4];
        pbVar20[4] = bVar5;
        bVar6 = pbVar19[5];
        pbVar20[5] = bVar6;
        bVar7 = pbVar19[6];
        pbVar20[6] = bVar7;
        bVar8 = pbVar19[7];
        pbVar20[7] = bVar8;
        bVar9 = pbVar19[8];
        pbVar20[8] = bVar9;
        bVar10 = pbVar19[9];
        pbVar20[9] = bVar10;
        bVar11 = pbVar19[10];
        pbVar20[10] = bVar11;
        bVar12 = pbVar19[0xb];
        pbVar20[0xb] = bVar12;
        bVar13 = pbVar19[0xc];
        pbVar20[0xc] = bVar13;
        bVar14 = pbVar19[0xd];
        pbVar20[0xd] = bVar14;
        bVar15 = pbVar19[0xe];
        pbVar20[0xe] = bVar15;
        bVar16 = pbVar19[0xf];
        pbVar20[0xf] = bVar16;
        if ((char)(bVar12 | bVar13 | bVar14 | bVar15 |
                   bVar8 | bVar9 | bVar10 | bVar11 |
                   bVar5 | bVar6 | bVar7 | bVar3 | bVar4 | bVar2 | bVar1 | bVar16) < '\0')
        goto LAB_002cf989;
        pbVar20 = pbVar20 + 0x10;
        pbVar19 = pbVar19 + 0x10;
        bVar18 = 1 < (int)uVar24;
        uVar24 = uVar24 - 1;
      } while (bVar18);
      uVar24 = 0;
LAB_002cf989:
      uVar22 = (uVar24 - (uVar22 >> 4)) * 0x10 + uVar22;
    }
    if (0 < (int)uVar22) {
      iVar23 = uVar22 + 1;
      do {
        bVar1 = *pbVar19;
        if ((char)bVar1 < '\0') {
          UVar21 = U_USING_DEFAULT_WARNING;
          goto LAB_002cf9d1;
        }
        pbVar19 = pbVar19 + 1;
        *pbVar20 = bVar1;
        pbVar20 = pbVar20 + 1;
        iVar23 = iVar23 + -1;
      } while (1 < iVar23);
    }
    if ((pbVar19 < pbVar17) &&
       (UVar21 = U_BUFFER_OVERFLOW_ERROR, pFromUArgs->targetLimit <= pbVar20)) {
LAB_002cf9d1:
      *pErrorCode = UVar21;
    }
    pToUArgs->source = (char *)pbVar19;
    pFromUArgs->target = (char *)pbVar20;
  }
  else {
    *pErrorCode = U_USING_DEFAULT_WARNING;
  }
  return;
}

Assistant:

static void U_CALLCONV
ucnv_ASCIIFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                   UConverterToUnicodeArgs *pToUArgs,
                   UErrorCode *pErrorCode) {
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity, length;

    uint8_t c;

    if(pToUArgs->converter->toULength > 0) {
        /* no handling of partial UTF-8 characters here, fall back to pivoting */
        *pErrorCode=U_USING_DEFAULT_WARNING;
        return;
    }

    /* set up the local pointers */
    source=(const uint8_t *)pToUArgs->source;
    sourceLimit=(const uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    /*
     * since the conversion here is 1:1 uint8_t:uint8_t, we need only one counter
     * for the minimum of the sourceLength and targetCapacity
     */
    length=(int32_t)(sourceLimit-source);
    if(length<targetCapacity) {
        targetCapacity=length;
    }

    /* unroll the loop with the most common case */
    if(targetCapacity>=16) {
        int32_t count, loops;
        uint8_t oredChars;

        loops=count=targetCapacity>>4;
        do {
            oredChars=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;

            /* were all 16 entries really valid? */
            if(oredChars>0x7f) {
                /* no, return to the first of these 16 */
                source-=16;
                target-=16;
                break;
            }
        } while(--count>0);
        count=loops-count;
        targetCapacity-=16*count;
    }

    /* conversion loop */
    c=0;
    while(targetCapacity>0 && (c=*source)<=0x7f) {
        ++source;
        *target++=c;
        --targetCapacity;
    }

    if(c>0x7f) {
        /* non-ASCII character, handle in standard converter */
        *pErrorCode=U_USING_DEFAULT_WARNING;
    } else if(source<sourceLimit && target>=(const uint8_t *)pFromUArgs->targetLimit) {
        /* target is full */
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }

    /* write back the updated pointers */
    pToUArgs->source=(const char *)source;
    pFromUArgs->target=(char *)target;
}